

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

void __thiscall Abs<0,_0>::Abs(Abs<0,_0> *this,IntView<0> _x,IntView<0> _y)

{
  IntView<0> *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Propagator *in_RDI;
  undefined8 in_R8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Propagator *p;
  
  p = in_RDI;
  Propagator::Propagator(in_RDI);
  Checker::Checker((Checker *)in_RDI);
  in_RDI->_vptr_Propagator = (_func_int **)&PTR__Abs_0031e4a0;
  in_RDI[1]._vptr_Propagator = (_func_int **)&DAT_0031e508;
  in_RDI[1].prop_id = (int)in_RSI;
  in_RDI[1].priority = (int)((ulong)in_RSI >> 0x20);
  in_RDI[1].satisfied = (Tchar)(char)in_RDX;
  in_RDI[1].in_queue = (bool)(char)((ulong)in_RDX >> 8);
  *(int6 *)&in_RDI[1].field_0x12 = (int6)((ulong)in_RDX >> 0x10);
  in_RDI[2]._vptr_Propagator = (_func_int **)in_RCX;
  in_RDI[2].prop_id = (int)in_R8;
  in_RDI[2].priority = (int)((ulong)in_R8 >> 0x20);
  in_RDI->priority = 1;
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  IntView<0>::attach(in_RCX,p,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

Abs(IntView<U> _x, IntView<V> _y) : x(_x), y(_y) {
		priority = 1;
		x.attach(this, 0, EVENT_LU);
		y.attach(this, 1, EVENT_U);
	}